

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_RadiusThrust
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  TObjPtr<AActor> *obj;
  byte *pbVar1;
  int fulldamagedistance;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  int bombdamage;
  FName local_34;
  
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003db056;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003db046:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003db056:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x530,
                  "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar5 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar5 == (AActor *)0x0) goto LAB_003daec3;
    bVar2 = DObject::IsKindOf((DObject *)pAVar5,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003db056;
    }
  }
  else {
    if (pAVar5 != (AActor *)0x0) goto LAB_003db046;
LAB_003daec3:
    pAVar5 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db0c5:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x531,
                    "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar3 = param[1].field_0.i;
LAB_003daf15:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db0e4:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x532,
                    "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[2].field_0.i;
LAB_003daf24:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db094:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x533,
                    "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar7 = param[3].field_0.i;
LAB_003daf33:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db075:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x534,
                    "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003db0c5;
    }
    iVar3 = param[1].field_0.i;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003daf15;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003db0e4;
    }
    iVar6 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003daf24;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003db094;
    }
    uVar7 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003daf33;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003db075;
    }
  }
  fulldamagedistance = param[4].field_0.i;
  bombdamage = 0x80;
  if (iVar3 != 0) {
    bombdamage = iVar3;
  }
  iVar3 = -bombdamage;
  if (0 < bombdamage) {
    iVar3 = bombdamage;
  }
  if (0 < iVar6) {
    iVar3 = iVar6;
  }
  if ((uVar7 & 4) == 0) {
    obj = &pAVar5->target;
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar4 != (AActor *)0x0) {
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
      if (((pAVar4->flags2).Value & 0x20000) != 0) {
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        pbVar1 = (byte *)((long)&(pAVar4->flags2).Value + 2);
        *pbVar1 = *pbVar1 & 0xfd;
        bVar2 = true;
        goto LAB_003daf91;
      }
    }
  }
  bVar2 = false;
LAB_003daf91:
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)&pAVar5->target);
  local_34.Index = (pAVar5->DamageType).super_FName.Index;
  P_RadiusAttack(pAVar5,pAVar4,bombdamage,iVar3,&local_34,uVar7 | 8,fulldamagedistance);
  P_CheckSplash(pAVar5,(double)iVar3);
  if (bVar2) {
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)&pAVar5->target);
    pbVar1 = (byte *)((long)&(pAVar5->flags2).Value + 2);
    *pbVar1 = *pbVar1 | 2;
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RadiusThrust)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(force);
	PARAM_INT_DEF	(distance);
	PARAM_INT_DEF	(flags);
	PARAM_INT_DEF	(fullthrustdistance);

	bool sourcenothrust = false;

	if (force == 0) force = 128;
	if (distance <= 0) distance = abs(force);

	// Temporarily negate MF2_NODMGTHRUST on the shooter, since it renders this function useless.
	if (!(flags & RTF_NOTMISSILE) && self->target != NULL && self->target->flags2 & MF2_NODMGTHRUST)
	{
		sourcenothrust = true;
		self->target->flags2 &= ~MF2_NODMGTHRUST;
	}

	P_RadiusAttack (self, self->target, force, distance, self->DamageType, flags | RADF_NODAMAGE, fullthrustdistance);
	P_CheckSplash(self, distance);

	if (sourcenothrust)
	{
		self->target->flags2 |= MF2_NODMGTHRUST;
	}
	return 0;
}